

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

void __thiscall
sqvector<SQOptimizer::Jump,_unsigned_int>::resize
          (sqvector<SQOptimizer::Jump,_unsigned_int> *this,size_type newsize,Jump *fill)

{
  Jump *pJVar1;
  Jump *pJVar2;
  JumpArg JVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  if (this->_allocated < newsize) {
    _realloc(this,newsize);
  }
  uVar8 = this->_size;
  if (uVar8 < newsize) {
    while (uVar8 < newsize) {
      pJVar1 = this->_vals;
      JVar3 = fill->jumpArg;
      uVar4 = *(undefined2 *)&fill->field_0x12;
      pJVar2 = pJVar1 + uVar8;
      pJVar2->modified = fill->modified;
      pJVar2->jumpArg = JVar3;
      *(undefined2 *)&pJVar2->field_0x12 = uVar4;
      iVar5 = fill->instructionIndex;
      iVar6 = fill->originalJumpTo;
      iVar7 = fill->jumpTo;
      pJVar1 = pJVar1 + uVar8;
      pJVar1->originalInstructionIndex = fill->originalInstructionIndex;
      pJVar1->instructionIndex = iVar5;
      pJVar1->originalJumpTo = iVar6;
      pJVar1->jumpTo = iVar7;
      uVar8 = this->_size + 1;
      this->_size = uVar8;
    }
  }
  else {
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(size_type newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(size_type i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }